

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

void evutil_adjust_hints_for_addrconfig_(addrinfo *hints)

{
  addrinfo *hints_local;
  
  if (((hints->ai_flags & 0x20U) != 0) && (hints->ai_family == 0)) {
    evutil_check_interfaces();
    if ((had_ipv4_address == 0) || (had_ipv6_address != 0)) {
      if ((had_ipv4_address == 0) && (had_ipv6_address != 0)) {
        hints->ai_family = 10;
      }
    }
    else {
      hints->ai_family = 2;
    }
  }
  return;
}

Assistant:

void
evutil_adjust_hints_for_addrconfig_(struct evutil_addrinfo *hints)
{
	if (!(hints->ai_flags & EVUTIL_AI_ADDRCONFIG))
		return;
	if (hints->ai_family != PF_UNSPEC)
		return;
	evutil_check_interfaces();
	if (had_ipv4_address && !had_ipv6_address) {
		hints->ai_family = PF_INET;
	} else if (!had_ipv4_address && had_ipv6_address) {
		hints->ai_family = PF_INET6;
	}
}